

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetimeedit.cpp
# Opt level: O1

void __thiscall QDateTimeEdit::setDisplayFormat(QDateTimeEdit *this,QString *format)

{
  QString *this_00;
  QString *pQVar1;
  Section SVar2;
  long *plVar3;
  QArrayData *pQVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  char cVar10;
  LayoutDirection LVar11;
  uint uVar12;
  QTime time;
  int iVar13;
  int iVar14;
  iterator iVar15;
  iterator iVar16;
  iterator iVar17;
  iterator iVar18;
  SectionNode *pSVar19;
  long lVar20;
  QDate min;
  QDate max;
  uint uVar21;
  uint uVar22;
  ulong uVar23;
  long in_FS_OFFSET;
  QStringView QVar24;
  QDateTime local_70 [8];
  QTime local_68;
  QTime local_64;
  QTime local_60;
  QTime local_5c;
  anon_union_24_3_e3d07ef4_for_data local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  plVar3 = *(long **)&(this->super_QAbstractSpinBox).super_QWidget.field_0x8;
  QVar24.m_data = (storage_type_conflict *)(format->d).size;
  QVar24.m_size = (qsizetype)(plVar3 + 0x7b);
  cVar10 = QDateTimeParser::parseFormat(QVar24);
  if (cVar10 != '\0') {
    this_00 = (QString *)(plVar3 + 0x98);
    if (plVar3[0x99] != 0) {
      pQVar4 = &((this_00->d).d)->super_QArrayData;
      (this_00->d).d = (Data *)0x0;
      plVar3[0x99] = 0;
      plVar3[0x9a] = 0;
      if (pQVar4 != (QArrayData *)0x0) {
        LOCK();
        (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar4,2,0x10);
        }
      }
    }
    LVar11 = QWidget::layoutDirection((QWidget *)this);
    if (LVar11 == RightToLeft) {
      QString::operator=(this_00,(QString *)format);
      pQVar1 = (QString *)(plVar3 + 0x87);
      if (plVar3[0x88] != 0) {
        pQVar4 = *(QArrayData **)pQVar1;
        *(undefined8 *)pQVar1 = 0;
        plVar3[0x88] = 0;
        plVar3[0x89] = 0;
        if (pQVar4 != (QArrayData *)0x0) {
          LOCK();
          (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
               (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(pQVar4,2,0x10);
          }
        }
      }
      uVar12 = (int)plVar3[0x83] - 1;
      if (-1 < (int)uVar12) {
        uVar23 = (ulong)uVar12;
        do {
          QString::append(pQVar1);
          QDateTimeParser::sectionNode((int)(plVar3 + 0x7b));
          QDateTimeParser::SectionNode::format();
          QString::append(pQVar1);
          if ((QArrayData *)local_58.shared != (QArrayData *)0x0) {
            LOCK();
            *(int *)local_58.shared = *(int *)local_58.shared + -1;
            UNLOCK();
            if (*(int *)local_58.shared == 0) {
              QArrayData::deallocate((QArrayData *)local_58.shared,2,0x10);
            }
          }
          bVar5 = 0 < (long)uVar23;
          uVar23 = uVar23 - 1;
        } while (bVar5);
      }
      QString::append(pQVar1);
      iVar15 = QList<QString>::begin((QList<QString> *)(plVar3 + 0x84));
      iVar16 = QList<QString>::end((QList<QString> *)(plVar3 + 0x84));
      std::__reverse<QList<QString>::iterator>(iVar15.i,iVar16.i);
      iVar17 = QList<QDateTimeParser::SectionNode>::begin
                         ((QList<QDateTimeParser::SectionNode> *)(plVar3 + 0x81));
      iVar18 = QList<QDateTimeParser::SectionNode>::end
                         ((QList<QDateTimeParser::SectionNode> *)(plVar3 + 0x81));
      pSVar19 = iVar18.i + -1;
      if (iVar17.i < pSVar19 && iVar17.i != iVar18.i) {
        do {
          SVar2 = (iVar17.i)->type;
          iVar13 = (iVar17.i)->zeroesAdded;
          iVar8 = (iVar17.i)->pos;
          iVar9 = (iVar17.i)->count;
          iVar14 = pSVar19->pos;
          iVar6 = pSVar19->count;
          iVar7 = pSVar19->zeroesAdded;
          (iVar17.i)->type = pSVar19->type;
          (iVar17.i)->pos = iVar14;
          (iVar17.i)->count = iVar6;
          (iVar17.i)->zeroesAdded = iVar7;
          pSVar19->type = SVar2;
          pSVar19->pos = iVar8;
          pSVar19->count = iVar9;
          pSVar19->zeroesAdded = iVar13;
          iVar17.i = iVar17.i + 1;
          pSVar19 = pSVar19 + -1;
        } while (iVar17.i < pSVar19);
      }
    }
    *(undefined1 *)((long)plVar3 + 0x4f9) = 1;
    uVar12 = *(uint *)(plVar3 + 0x7d);
    uVar21 = (uVar12 & 0xe) + 0x10;
    if ((uVar12 & 0x30) == 0) {
      uVar21 = uVar12 & 0xe;
    }
    uVar22 = uVar21 + 0x100;
    if ((uVar12 & 0x3100) == 0) {
      uVar22 = uVar21;
    }
    uVar22 = uVar12 & 0x200 | uVar22 + (uVar12 & 1);
    uVar21 = uVar22 | 0x400;
    if ((uVar12 & 0xc00) == 0) {
      uVar21 = uVar22;
    }
    *(uint *)(plVar3 + 0x8e) = uVar21;
    (**(code **)(*plVar3 + 0xf8))(plVar3);
    lVar20 = plVar3[0x83] + -1;
    if ((long)(int)plVar3[0x7c] <= plVar3[0x83] + -1) {
      lVar20 = (long)(int)plVar3[0x7c];
    }
    *(int *)(plVar3 + 0x7c) = (int)lVar20;
    uVar12 = *(uint *)(plVar3 + 0x8e);
    if ((uVar12 & 0x700) == 0 && (uVar12 & 0x1f) != 0) {
      time.mds = ::QVariant::toTime();
      min.jd = ::QVariant::toDate();
      max.jd = ::QVariant::toDate();
      setDateRange(this,min,max);
      iVar13 = ::QVariant::toTime();
      iVar14 = ::QVariant::toTime();
      if (iVar14 <= iVar13) {
        QTime::QTime(&local_5c,0,0,0,0);
        QTime::QTime(&local_60,0x17,0x3b,0x3b,999);
        setTimeRange(this,local_5c,local_60);
        setTime(this,time);
      }
    }
    else if ((uVar12 & 0x1f) == 0 && (uVar12 & 0x700) != 0) {
      QTime::QTime(&local_64,0,0,0,0);
      QTime::QTime(&local_68,0x17,0x3b,0x3b,999);
      setTimeRange(this,local_64,local_68);
      ::QVariant::toDate();
      QDate::startOfDay((QTimeZone *)local_70);
      ::QVariant::QVariant((QVariant *)&local_58,local_70);
      ::QVariant::operator=((QVariant *)(plVar3 + 0x54),(QVariant *)&local_58);
      ::QVariant::~QVariant((QVariant *)&local_58);
      QDateTime::~QDateTime(local_70);
    }
    (**(code **)(*plVar3 + 0xc0))(plVar3);
    (**(code **)(*plVar3 + 0xe8))(plVar3,0xffffffff,0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDateTimeEdit::setDisplayFormat(const QString &format)
{
    Q_D(QDateTimeEdit);
    if (d->parseFormat(format)) {
        d->unreversedFormat.clear();
        if (isRightToLeft()) {
            d->unreversedFormat = format;
            d->displayFormat.clear();
            for (int i=d->sectionNodes.size() - 1; i>=0; --i) {
                d->displayFormat += d->separators.at(i + 1);
                d->displayFormat += d->sectionNode(i).format();
            }
            d->displayFormat += d->separators.at(0);
            std::reverse(d->separators.begin(), d->separators.end());
            std::reverse(d->sectionNodes.begin(), d->sectionNodes.end());
        }

        d->formatExplicitlySet = true;
        d->sections = QDateTimeEditPrivate::convertSections(d->display);
        d->clearCache();

        d->currentSectionIndex = qMin(d->currentSectionIndex, d->sectionNodes.size() - 1);
        const bool timeShown = (d->sections & TimeSections_Mask);
        const bool dateShown = (d->sections & DateSections_Mask);
        Q_ASSERT(dateShown || timeShown);
        if (timeShown && !dateShown) {
            QTime time = d->value.toTime();
            setDateRange(d->value.toDate(), d->value.toDate());
            if (d->minimum.toTime() >= d->maximum.toTime()) {
                setTimeRange(QDATETIMEEDIT_TIME_MIN, QDATETIMEEDIT_TIME_MAX);
                // if the time range became invalid during the adjustment, the time would have been reset
                setTime(time);
            }
        } else if (dateShown && !timeShown) {
            setTimeRange(QDATETIMEEDIT_TIME_MIN, QDATETIMEEDIT_TIME_MAX);
            d->value = d->value.toDate().startOfDay(d->timeZone);
        }
        d->updateEdit();
        d->editorCursorPositionChanged(-1, 0);
    }
}